

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocumentlayout.cpp
# Opt level: O2

void drawCellBorder(QTextDocumentLayoutPrivate *p,QPainter *painter,QTextTable *table,
                   QTextTableData *td,QTextTableCell *cell,QRectF *borderRect,Edge edge,
                   int forceHeaderRow,bool adjustTopAnchor,bool adjustBottomAnchor,
                   bool ignoreEdgesAbove)

{
  QBrush QVar1;
  undefined4 uVar2;
  BorderStyle BVar3;
  long in_FS_OFFSET;
  QBrush brush;
  QTextFrameFormat local_88;
  QTextFormat local_78;
  undefined1 local_68 [16];
  undefined1 local_58 [24];
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._0_8_ = -NAN;
  local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_40 = &DAT_aaaaaaaaaaaaaaaa;
  axisEdgeData((EdgeData *)local_58,table,td,cell,edge);
  if (((double)local_58._0_8_ != 0.0) || (NAN((double)local_58._0_8_))) {
    local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QTextTableCell::format((QTextTableCell *)&local_78);
    QTextFormat::toTableCellFormat((QTextFormat *)local_68);
    QTextFormat::~QTextFormat(&local_78);
    brush.d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
    super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
    super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl = (DataPtr)&DAT_aaaaaaaaaaaaaaaa;
    QBrush::QBrush(&brush);
    if ((local_40._4_4_ == ClassExplicit) || (td->drawGrid != true)) {
      (*(code *)(&DAT_005fb5f0 + *(int *)(&DAT_005fb5f0 + ((ulong)local_40 & 0xffffffff) * 4)))();
      return;
    }
    QTextTable::format((QTextTable *)&local_78);
    BVar3 = QTextFrameFormat::borderStyle((QTextFrameFormat *)&local_78);
    QTextFormat::~QTextFormat(&local_78);
    QTextTable::format((QTextTable *)&local_78);
    QTextFrameFormat::borderBrush(&local_88);
    QVar1 = brush;
    brush.d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
    super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
    super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl =
         (DataPtr)(DataPtr)local_88.super_QTextFormat.d.d.ptr;
    local_88.super_QTextFormat.d.d.ptr =
         (totally_ordered_wrapper<QTextFormatPrivate_*>)
         (totally_ordered_wrapper<QTextFormatPrivate_*>)
         QVar1.d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
         super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
         super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl;
    QBrush::~QBrush((QBrush *)&local_88);
    QTextFormat::~QTextFormat(&local_78);
    if (BVar3 != BorderStyle_None) {
      if (*(int *)((long)brush.d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>.
                         _M_t.super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                         super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl + 4) == 0) {
        QBrush::operator=(&brush,black);
      }
      local_78.d.d.ptr = (totally_ordered_wrapper<QTextFormatPrivate_*>)cell->table;
      local_78.format_type = cell->fragment;
      local_78._12_4_ = 0xaaaaaaaa;
      uVar2 = local_78._12_4_;
      local_78._12_4_ = 0xaaaaaaaa;
      if (forceHeaderRow != -1) {
        QTextTableCell::column(cell);
        QTextTable::cellAt((QTextTable *)&local_88,(int)table,forceHeaderRow);
        local_78.d.d.ptr = local_88.super_QTextFormat.d.d.ptr;
        local_78.format_type = local_88.super_QTextFormat.format_type;
        uVar2 = local_78._12_4_;
      }
      local_78._12_4_ = uVar2;
      (*(code *)(&DAT_005fb600 + *(int *)(&DAT_005fb600 + (ulong)edge * 4)))();
      return;
    }
    QBrush::~QBrush(&brush);
    QTextFormat::~QTextFormat((QTextFormat *)local_68);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static inline
void drawCellBorder(const QTextDocumentLayoutPrivate *p, QPainter *painter,
                    QTextTable *table, const QTextTableData *td, const QTextTableCell &cell,
                    const QRectF &borderRect, QCss::Edge edge,
                    int forceHeaderRow, bool adjustTopAnchor, bool adjustBottomAnchor,
                    bool ignoreEdgesAbove)
{
    QPointF p1, p2;
    qreal wh = 0;
    qreal wv = 0;
    EdgeData edgeData = axisEdgeData(table, td, cell, edge);

    if (edgeData.width == 0)
        return;

    QTextTableCellFormat fmt = edgeData.cell.format().toTableCellFormat();
    QTextFrameFormat::BorderStyle borderStyle = QTextFrameFormat::BorderStyle_None;
    QBrush brush;

    if (edgeData.edgeClass != EdgeData::ClassExplicit && td->drawGrid) {
        borderStyle = table->format().borderStyle();
        brush = table->format().borderBrush();
    }
    else {
        switch (edgeData.edge) {
        case QCss::TopEdge:
            brush = fmt.topBorderBrush();
            borderStyle = fmt.topBorderStyle();
            break;
        case QCss::BottomEdge:
            brush = fmt.bottomBorderBrush();
            borderStyle = fmt.bottomBorderStyle();
            break;
        case QCss::LeftEdge:
            brush = fmt.leftBorderBrush();
            borderStyle = fmt.leftBorderStyle();
            break;
        case QCss::RightEdge:
            brush = fmt.rightBorderBrush();
            borderStyle = fmt.rightBorderStyle();
            break;
        default:
            Q_UNREACHABLE();
            break;
        }
    }

    if (borderStyle == QTextFrameFormat::BorderStyle_None)
        return;

    // assume black if not explicit brush is set
    if (brush.style() == Qt::NoBrush)
        brush = Qt::black;

    QTextTableCell cellOrHeader = cell;
    if (forceHeaderRow != -1)
        cellOrHeader = table->cellAt(forceHeaderRow, cell.column());

    // adjust start and end anchors (e.g. left/right for top) according to priority rules
    switch (edge) {
    case QCss::TopEdge:
        wv = p->scaleToDevice(edgeData.width);
        p1 = borderRect.topLeft()
                + QPointF(qFloor(prioritizedEdgeAnchorOffset(p, table, td, cell, edgeData, QCss::LeftEdge, false, ignoreEdgesAbove)), 0);
        p2 = borderRect.topRight()
                + QPointF(-qCeil(prioritizedEdgeAnchorOffset(p, table, td, cell, edgeData, QCss::RightEdge, true, ignoreEdgesAbove)), 0);
        break;
    case QCss::BottomEdge:
        wv = p->scaleToDevice(edgeData.width);
        p1 = borderRect.bottomLeft()
                + QPointF(qFloor(prioritizedEdgeAnchorOffset(p, table, td, cell, edgeData, QCss::LeftEdge, false, false)), -wv);
        p2 = borderRect.bottomRight()
                + QPointF(-qCeil(prioritizedEdgeAnchorOffset(p, table, td, cell, edgeData, QCss::RightEdge, true, false)), -wv);
        break;
    case QCss::LeftEdge:
        wh = p->scaleToDevice(edgeData.width);
        p1 = borderRect.topLeft()
                + QPointF(0, adjustTopAnchor ? qFloor(prioritizedEdgeAnchorOffset(p, table, td, cellOrHeader, edgeData,
                                                                                  forceHeaderRow != -1 ? QCss::BottomEdge : QCss::TopEdge,
                                                                                  false, ignoreEdgesAbove))
                                             : 0);
        p2 = borderRect.bottomLeft()
                + QPointF(0, adjustBottomAnchor ? -qCeil(prioritizedEdgeAnchorOffset(p, table, td, cell, edgeData, QCss::BottomEdge, true, false))
                                                : 0);
        break;
    case QCss::RightEdge:
        wh = p->scaleToDevice(edgeData.width);
        p1 = borderRect.topRight()
                + QPointF(-wh, adjustTopAnchor ? qFloor(prioritizedEdgeAnchorOffset(p, table, td, cellOrHeader, edgeData,
                                                                                    forceHeaderRow != -1 ? QCss::BottomEdge : QCss::TopEdge,
                                                                                    false, ignoreEdgesAbove))
                                               : 0);
        p2 = borderRect.bottomRight()
                + QPointF(-wh, adjustBottomAnchor ? -qCeil(prioritizedEdgeAnchorOffset(p, table, td, cell, edgeData, QCss::BottomEdge, true, false))
                                                  : 0);
        break;
    default: break;
    }

    // for borderCollapse move edge width/2 pixel out of the borderRect
    // so that it shares space with the adjacent cell's edge.
    // to avoid fractional offsets, qCeil/qFloor is used
    if (td->borderCollapse) {
        QPointF offset;
        switch (edge) {
        case QCss::TopEdge:
            offset = QPointF(0, -qCeil(collapseOffset(p, edgeData)));
            break;
        case QCss::BottomEdge:
            offset = QPointF(0, qFloor(collapseOffset(p, edgeData)));
            break;
        case QCss::LeftEdge:
            offset = QPointF(-qCeil(collapseOffset(p, edgeData)), 0);
            break;
        case QCss::RightEdge:
            offset = QPointF(qFloor(collapseOffset(p, edgeData)), 0);
            break;
        default: break;
        }
        p1 += offset;
        p2 += offset;
    }

    QCss::BorderStyle cssStyle = static_cast<QCss::BorderStyle>(borderStyle + 1);

// this reveals errors in the drawing logic
#ifdef COLLAPSE_DEBUG
    QColor c = brush.color();
    c.setAlpha(150);
    brush.setColor(c);
#endif

    qDrawEdge(painter, p1.x(), p1.y(), p2.x() + wh, p2.y() + wv, 0, 0, edge, cssStyle, brush);
}